

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedSingleFileIndexedStorage.hpp
# Opt level: O3

void __thiscall
supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>::
SortedSingleFileIndexedStorage
          (SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char> *this,
          vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
          *newer,string *dataFileName,shared_ptr<supermap::io::FileManager> *fileManager,
          char batchSize,InnerRegisterSupplier *registerSupplier)

{
  _Manager_type p_Var1;
  pointer pSVar2;
  pointer pSVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  pointer poVar7;
  ulong uVar8;
  char cVar9;
  char cVar10;
  undefined2 uVar11;
  _Storage<supermap::KeyValue<char,_char>,_true> _Var12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  undefined3 in_register_00000081;
  size_type sVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  KeyValue<char,_char> minItem;
  vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  writeBuffer;
  vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
  frontLine;
  vector<char,_std::allocator<char>_> currentFrontPointers;
  KeyValue<char,_char> local_e6;
  int local_e4;
  SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char> *local_e0;
  vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_> local_d8;
  size_type local_c0;
  vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
  local_b8;
  vector<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
  *local_a0;
  size_type local_98;
  path local_90;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type local_50;
  shared_ptr<supermap::io::FileManager> local_48;
  pointer local_38;
  
  local_e0 = this;
  std::filesystem::__cxx11::path::path(&local_90,dataFileName,auto_format);
  local_48.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_48.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (fileManager->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_58 = (_Manager_type)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = registerSupplier->_M_invoker;
  p_Var1 = (registerSupplier->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_68._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(registerSupplier->super__Function_base)._M_functor;
    local_68._8_8_ = *(undefined8 *)((long)&(registerSupplier->super__Function_base)._M_functor + 8)
    ;
    (registerSupplier->super__Function_base)._M_manager = (_Manager_type)0x0;
    registerSupplier->_M_invoker = (_Invoker_type)0x0;
    local_58 = p_Var1;
  }
  SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>::SingleFileIndexedStorage
            (&local_e0->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>,
             &local_90,&local_48,(InnerRegisterSupplier *)&local_68);
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (local_48.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::filesystem::__cxx11::path::~path(&local_90);
  (local_e0->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
  super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
  super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>._vptr_OrderedStorage =
       (_func_int **)&PTR_append_001ffcf8;
  (local_e0->super_Findable<supermap::KeyValue<char,_char>,_char>)._vptr_Findable =
       (_func_int **)&DAT_001ffd40;
  pSVar2 = (newer->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (newer->
           super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  sVar17 = ((long)pSVar3 - (long)pSVar2 >> 3) * 0x6db6db6db6db6db7;
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_90,sVar17,(allocator_type *)&local_b8);
  local_d8.
  super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_3_ =
       (uint3)(ushort)local_d8.
                      super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
  ::vector(&local_b8,sVar17,(value_type *)&local_d8,(allocator_type *)&local_e6);
  local_e4 = CONCAT31(in_register_00000081,batchSize);
  if (pSVar3 == pSVar2) {
    lVar18 = 0;
    local_c0 = sVar17;
  }
  else {
    lVar20 = sVar17 + (sVar17 == 0);
    lVar19 = 2;
    lVar16 = 0;
    lVar18 = 0;
    local_c0 = sVar17;
    do {
      pSVar2 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      cVar9 = (**(code **)(*(long *)((long)&(pSVar2->
                                            super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                            ).
                                            super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                            .
                                            super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                            ._vptr_OrderedStorage + lVar16) + 8))
                        ((long)&(pSVar2->
                                super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                ).super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                                super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                                _vptr_OrderedStorage + lVar16);
      poVar7 = local_b8.
               super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ('\0' < cVar9) {
        pSVar2 = (newer->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (**(code **)(*(long *)((long)&(pSVar2->
                                               super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                               ).
                                               super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                               .
                                               super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                               ._vptr_OrderedStorage + lVar16) + 0x20))
                           ((long)&(pSVar2->
                                   super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                   ).
                                   super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                                   super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                                   _vptr_OrderedStorage + lVar16,0);
        if (*(char *)((long)&(poVar7->
                             super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>).
                             _M_payload.
                             super__Optional_payload_base<supermap::KeyValue<char,_char>_>.
                             _M_payload + lVar19) == '\x01') {
          *(undefined1 *)
           ((long)&(poVar7->super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>).
                   _M_payload.super__Optional_payload_base<supermap::KeyValue<char,_char>_>.
                   _M_payload + lVar19) = 0;
        }
        *(undefined2 *)((long)poVar7 + lVar19 + -2) = uVar11;
        *(undefined1 *)
         ((long)&(poVar7->super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>).
                 _M_payload.super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_payload
         + lVar19) = 1;
        pSVar2 = (newer->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        cVar9 = (**(code **)(*(long *)((long)&(pSVar2->
                                              super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                              ).
                                              super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                              .
                                              super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                              ._vptr_OrderedStorage + lVar16) + 8))
                          ((long)&(pSVar2->
                                  super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                  ).super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                  .super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.
                                  _vptr_OrderedStorage + lVar16);
        lVar18 = lVar18 + cVar9;
      }
      lVar16 = lVar16 + 0x38;
      lVar19 = lVar19 + 3;
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
  }
  (*(local_e0->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>).
    super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
    super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.register_.
    super_StorageItemRegister<supermap::KeyValue<char,_char>,_supermap::CountingStorageInfo<char,_void>_>
    .
    super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<char,_char>,_supermap::CountingStorageInfo<char,_void>_>_>
    ._vptr_Cloneable[5])
            (&(local_e0->super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>)
              .super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>.
              super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>.register_,lVar18);
  local_d8.
  super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar9 = (char)local_e4;
  local_98 = (size_type)cVar9;
  std::vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>::
  reserve(&local_d8,local_98);
  uVar13 = (int)local_c0 - 1;
  local_c0 = (size_type)uVar13;
  if (-1 < (int)uVar13) {
    local_e4 = (int)cVar9;
    uVar15 = 0;
    sVar17 = local_c0;
    local_a0 = newer;
    bVar6 = false;
    do {
      do {
        uVar8 = uVar15;
        bVar5 = bVar6;
        if ((local_b8.
             super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[sVar17].
             super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
             super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged == true) &&
           (uVar8 = sVar17, bVar5 = true, bVar6)) {
          if (local_b8.
              super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar15].
              super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
              super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged == false) {
            std::__throw_bad_optional_access();
          }
          cVar9 = local_b8.
                  super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar15].
                  super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
                  super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_payload._M_value.
                  key;
          cVar10 = local_b8.
                   super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[sVar17].
                   super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
                   super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_payload._M_value
                   .key;
          bVar5 = bVar6;
          if ((cVar9 <= cVar10) && (uVar8 = uVar15, cVar10 == cVar9)) {
            cVar9 = local_90._M_pathname._M_dataplus._M_p[sVar17];
            local_90._M_pathname._M_dataplus._M_p[sVar17] = cVar9 + '\x01';
            pSVar2 = (newer->
                     super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            cVar10 = (**(code **)(*(long *)&pSVar2[sVar17].
                                            super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                            .
                                            super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                            .
                                            super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                 + 8))(pSVar2 + sVar17);
            newer = local_a0;
            if ((char)(cVar9 + '\x01') < cVar10) {
              local_38 = local_b8.
                         super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pSVar2 = (local_a0->
                       super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              _Var12 = (_Storage<supermap::KeyValue<char,_char>,_true>)
                       (**(code **)(*(long *)&pSVar2[sVar17].
                                              super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                              .
                                              super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                              .
                                              super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                   + 0x20))
                                 (pSVar2 + sVar17,(int)local_90._M_pathname._M_dataplus._M_p[sVar17]
                                 );
              local_38[sVar17].super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>.
              _M_payload.super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_payload =
                   _Var12;
              local_38[sVar17].super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>.
              _M_payload.super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged =
                   true;
            }
            else if (local_b8.
                     super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[sVar17].
                     super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
                     super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged ==
                     true) {
              local_b8.
              super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[sVar17].
              super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
              super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged = false;
            }
          }
        }
        uVar15 = uVar8;
        bVar4 = 0 < (long)sVar17;
        sVar17 = sVar17 - 1;
        bVar6 = bVar5;
      } while (bVar4);
      if (!bVar5) break;
      if (local_b8.
          super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar15].
          super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
          super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged == false) {
        std::__throw_bad_optional_access();
      }
      local_e6 = *(KeyValue<char,_char> *)
                  (local_b8.
                   super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar15);
      iVar14 = (int)uVar15;
      cVar9 = local_90._M_pathname._M_dataplus._M_p[iVar14];
      local_90._M_pathname._M_dataplus._M_p[iVar14] = cVar9 + '\x01';
      pSVar2 = (newer->
               super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      cVar10 = (**(code **)(*(long *)&pSVar2[iVar14].
                                      super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                      .
                                      super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                      .
                                      super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                           + 8))(pSVar2 + iVar14);
      poVar7 = local_b8.
               super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((char)(cVar9 + '\x01') < cVar10) {
        pSVar2 = (newer->
                 super__Vector_base<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>,_std::allocator<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void,_char>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        _Var12 = (_Storage<supermap::KeyValue<char,_char>,_true>)
                 (**(code **)(*(long *)&pSVar2[iVar14].
                                        super_SingleFileIndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                        .
                                        super_IndexedStorage<supermap::KeyValue<char,_char>,_char,_void>
                                        .
                                        super_OrderedStorage<supermap::KeyValue<char,_char>,_char,_void>
                             + 0x20))
                           (pSVar2 + iVar14,(int)local_90._M_pathname._M_dataplus._M_p[iVar14]);
        poVar7[iVar14].super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
        super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_payload = _Var12;
        poVar7[iVar14].super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
        super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged = true;
      }
      else if (local_b8.
               super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar14].
               super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
               super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged == true) {
        local_b8.
        super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar14].
        super__Optional_base<supermap::KeyValue<char,_char>,_true,_true>._M_payload.
        super__Optional_payload_base<supermap::KeyValue<char,_char>_>._M_engaged = false;
      }
      sVar17 = local_c0;
      std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>::
      emplace_back<supermap::KeyValue<char,char>>
                ((vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>
                  *)&local_d8,&local_e6);
      if (local_e4 <=
          (char)((uint)((int)local_d8.
                             super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (int)local_d8.
                            super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 1)) {
        SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void>::
        appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<char,char>,void>
                  ((SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void> *)local_e0);
        if (local_d8.
            super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_d8.
            super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_d8.
          super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_d8.
               super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        std::
        vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>::
        reserve(&local_d8,local_98);
      }
      bVar6 = false;
      uVar15 = 0;
    } while (-1 < (int)sVar17);
  }
  SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void>::
  appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,supermap::SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void>::appendAll<__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,void>(__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>,__gnu_cxx::__normal_iterator<supermap::KeyValue<char,char>*,std::vector<supermap::KeyValue<char,char>,std::allocator<supermap::KeyValue<char,char>>>>)::_lambda(auto:1)_1_,supermap::KeyValue<char,char>,void>
            ((SingleFileIndexedStorage<supermap::KeyValue<char,char>,char,void> *)local_e0,
             local_d8.
             super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_d8.
             super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (local_d8.
      super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_d8.
      super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_d8.
    super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_d8.
         super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  std::vector<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>::
  reserve(&local_d8,local_98);
  if (local_d8.
      super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<supermap::KeyValue<char,_char>,_std::allocator<supermap::KeyValue<char,_char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.
      super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<std::optional<supermap::KeyValue<char,_char>_>,_std::allocator<std::optional<supermap::KeyValue<char,_char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90._M_pathname._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_90._M_pathname._M_dataplus._M_p,
                    local_90._M_pathname.field_2._M_allocated_capacity -
                    (long)local_90._M_pathname._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit SortedSingleFileIndexedStorage(
        const std::vector<SortedSingleFileIndexedStorage<T, IndexT, RegisterInfo, FindPattern>> &newer,
        std::string dataFileName,
        std::shared_ptr<io::FileManager> fileManager,
        IndexT batchSize,
        InnerRegisterSupplier registerSupplier
    ) : SingleFileIndexedStorage<T, IndexT, RegisterInfo>(
        std::move(dataFileName),
        std::move(fileManager),
        std::move(registerSupplier)
    ) {
        const std::size_t storagesCount = newer.size();
        std::vector<IndexT> currentFrontPointers(storagesCount);
        std::vector<std::optional<T>> frontLine(storagesCount, std::nullopt);
        std::uint64_t totalSize = 0;
        for (std::size_t i = 0; i < storagesCount; ++i) {
            if (newer[i].getItemsCount() > 0) {
                frontLine[i].emplace(newer[i].get(0));
                totalSize += newer[i].getItemsCount();
            }
        }
        getRegister().reserve(totalSize);
        auto updateOnce = [&](std::int32_t i) {
            if (++currentFrontPointers[i] < newer[i].getItemsCount()) {
                frontLine[i].emplace(newer[i].get(currentFrontPointers[i]));
            } else {
                frontLine[i].reset();
            }
        };

        std::vector<T> writeBuffer;
        writeBuffer.reserve(batchSize);

        auto dropWriteBuffer = [&]() {
            appendAll(writeBuffer.begin(), writeBuffer.end());
            writeBuffer.clear();
            writeBuffer.reserve(batchSize);
        };

        while (true) {
            std::size_t min = 0;
            bool hasMin = false;
            for (std::int32_t i = storagesCount - 1; i >= 0; --i) {
                if (!frontLine[i].has_value()) {
                    continue;
                }
                if (!hasMin) {
                    hasMin = true;
                    min = i;
                    continue;
                }
                if (frontLine[i].value() < frontLine[min].value()) {
                    min = i;
                } else if (frontLine[i].value() == frontLine[min].value()) {
                    updateOnce(i);
                }
            }
            if (!hasMin) {
                break;
            }
            T minItem = frontLine[min].value();
            updateOnce(min);
            writeBuffer.push_back(std::move(minItem));
            if (static_cast<IndexT>(writeBuffer.size()) >= batchSize) {
                dropWriteBuffer();
            }
        }
        dropWriteBuffer();
    }